

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O2

int Cbs2_VarIsJust(Cbs2_Man_t *p,Gia_Obj_t *pVar,int iVar)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar1 = (uint)*(undefined8 *)pVar;
  uVar3 = 0;
  if ((~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1) {
    iVar2 = Cbs2_VarIsAssigned(p,iVar - (uVar1 & 0x1fffffff));
    uVar3 = 0;
    if (iVar2 == 0) {
      uVar3 = Cbs2_VarIsAssigned(p,iVar - (*(uint *)&pVar->field_0x4 & 0x1fffffff));
      uVar3 = uVar3 ^ 1;
    }
  }
  return uVar3;
}

Assistant:

static inline int   Cbs2_VarIsJust( Cbs2_Man_t * p, Gia_Obj_t * pVar, int iVar )      { return Gia_ObjIsAnd(pVar) && !Cbs2_VarIsAssigned(p, Gia_ObjFaninId0(pVar, iVar)) && !Cbs2_VarIsAssigned(p, Gia_ObjFaninId1(pVar, iVar));  }